

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

bool __thiscall QGraphicsScene::sendEvent(QGraphicsScene *this,QGraphicsItem *item,QEvent *event)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsScenePrivate *pQVar1;
  QGraphicsScene *pQVar2;
  QEvent *in_RDX;
  QGraphicsItem *in_RSI;
  QGraphicsScenePrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *d;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  QGraphicsScenePrivate *this_01;
  bool local_49;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QGraphicsScene *)0x9c5e1a);
  if (in_RSI == (QGraphicsItem *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,line,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    QMessageLogger::warning(local_28,"QGraphicsScene::sendEvent: cannot send event to a null item");
    local_49 = false;
  }
  else {
    pQVar1 = (QGraphicsScenePrivate *)QGraphicsItem::scene((QGraphicsItem *)0x9c5e5e);
    if (pQVar1 == in_RDI) {
      local_49 = QGraphicsScenePrivate::sendEvent(this_01,in_RSI,in_RDX);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,line,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      pQVar2 = QGraphicsItem::scene((QGraphicsItem *)0x9c5e8f);
      QMessageLogger::warning
                (local_48,
                 "QGraphicsScene::sendEvent: item %p\'s scene (%p) is different from this scene (%p)"
                 ,in_RSI,pQVar2,in_RDI);
      local_49 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScene::sendEvent(QGraphicsItem *item, QEvent *event)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::sendEvent: cannot send event to a null item");
        return false;
    }
    if (item->scene() != this) {
        qWarning("QGraphicsScene::sendEvent: item %p's scene (%p)"
                 " is different from this scene (%p)",
                 item, item->scene(), this);
        return false;
    }
    return d->sendEvent(item, event);
}